

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void __thiscall NJamSpell::TTokenizer::TTokenizer(TTokenizer *this)

{
  TTokenizer *this_local;
  
  this->_vptr_TTokenizer = (_func_int **)&PTR_Dump_00298490;
  std::unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  ::unordered_set(&this->Alphabet);
  std::locale::locale(&this->Locale,"en_US.utf-8");
  return;
}

Assistant:

TTokenizer::TTokenizer()
    : Locale("en_US.utf-8")
{
}